

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_text.cpp
# Opt level: O0

void __thiscall
flatbuffers::JsonPrinter::GenField<double>
          (JsonPrinter *this,FieldDef *fd,Table *table,bool fixed,int indent)

{
  voffset_t field;
  bool bVar1;
  double *pdVar2;
  double dVar3;
  Optional<double> OVar4;
  _Storage<double,_true> local_38;
  Optional<double> opt;
  int indent_local;
  bool fixed_local;
  Table *table_local;
  FieldDef *fd_local;
  JsonPrinter *this_local;
  
  opt.super__Optional_base<double,_true,_true>._M_payload.super__Optional_payload_base<double>._8_4_
       = indent;
  opt.super__Optional_base<double,_true,_true>._M_payload.super__Optional_payload_base<double>.
  _15_1_ = fixed;
  if (fixed) {
    dVar3 = Struct::GetField<double>((Struct *)table,(uint)(fd->value).offset);
    PrintScalar<double>(this,dVar3,&(fd->value).type,
                        opt.super__Optional_base<double,_true,_true>._M_payload.
                        super__Optional_payload_base<double>._8_4_);
  }
  else {
    bVar1 = FieldDef::IsOptional(fd);
    if (bVar1) {
      OVar4 = Table::GetOptional<double,double>(table,(fd->value).offset);
      local_38 = OVar4.super__Optional_base<double,_true,_true>._M_payload.
                 super__Optional_payload_base<double>._M_payload;
      opt.super__Optional_base<double,_true,_true>._M_payload.super__Optional_payload_base<double>.
      _M_payload._0_1_ =
           OVar4.super__Optional_base<double,_true,_true>._M_payload.
           super__Optional_payload_base<double>._M_engaged;
      bVar1 = std::optional::operator_cast_to_bool((optional *)&local_38);
      if (bVar1) {
        pdVar2 = std::optional<double>::operator*((optional<double> *)&local_38);
        PrintScalar<double>(this,*pdVar2,&(fd->value).type,
                            opt.super__Optional_base<double,_true,_true>._M_payload.
                            super__Optional_payload_base<double>._8_4_);
      }
      else {
        std::__cxx11::string::operator+=((string *)this->text,"null");
      }
    }
    else {
      field = (fd->value).offset;
      dVar3 = GetFieldDefault<double>(fd);
      dVar3 = Table::GetField<double>(table,field,dVar3);
      PrintScalar<double>(this,dVar3,&(fd->value).type,
                          opt.super__Optional_base<double,_true,_true>._M_payload.
                          super__Optional_payload_base<double>._8_4_);
    }
  }
  return;
}

Assistant:

void GenField(const FieldDef &fd, const Table *table, bool fixed,
                int indent) {
    if (fixed) {
      PrintScalar(
          reinterpret_cast<const Struct *>(table)->GetField<T>(fd.value.offset),
          fd.value.type, indent);
    } else if (fd.IsOptional()) {
      auto opt = table->GetOptional<T, T>(fd.value.offset);
      if (opt) {
        PrintScalar(*opt, fd.value.type, indent);
      } else {
        text += "null";
      }
    } else {
      PrintScalar(table->GetField<T>(fd.value.offset, GetFieldDefault<T>(fd)),
                  fd.value.type, indent);
    }
  }